

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O3

Var Js::TaggedInt::ShiftRight(Var aLeft,Var aRight)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  
  if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      pcVar5 = "(Is(aValue))";
      pcVar4 = "Ensure var is actually a \'TaggedInt\'";
      uVar6 = 0x43;
      goto LAB_00b0c2eb;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    pcVar5 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar4 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar6 = 0x2a;
LAB_00b0c2eb:
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,uVar6,pcVar5,pcVar4);
    if (!bVar2) goto LAB_00b0c3db;
    *puVar3 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00b0c3c1;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    pcVar5 = "(Is(aValue))";
    pcVar4 = "Ensure var is actually a \'TaggedInt\'";
    uVar6 = 0x51;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    pcVar5 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar4 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar6 = 0x2a;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,uVar6,pcVar5,pcVar4);
  if (!bVar2) {
LAB_00b0c3db:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00b0c3c1:
  return (Var)((ulong)(uint)((int)aLeft >> ((byte)aRight & 0x1f)) | 0x1000000000000);
}

Assistant:

Var TaggedInt::ShiftRight(Var aLeft, Var aRight)
    {
        //
        // If aLeft was an Int31 coming in, then the result must always be an Int31 going out because
        // shifting right only makes value smaller. Therefore, we may call ToVarUnchecked()
        // directly.
        //

        int nValue      = ToInt32(aLeft);
        uint32 nShift   = ToUInt32(aRight);

        return ToVarUnchecked(nValue >> (nShift & 0x1F));
    }